

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmsg.c
# Opt level: O3

void mess_reset(void)

{
  return;
}

Assistant:

void mess_reset(void) {
#ifdef MAIKO_HANDLE_CONSOLE_MESSAGES
  int console_fd;
  close(log_id);
  close(cons_tty);
  close(cons_pty);
/* Try to make /dev/console be the real console again */
/*** This sequence sometimes causes SunOS to panic on SunOS4.0(and 4.0.1).
    TIOCCONS problem ???
    if ((console_fd = open("/dev/console", 0)) >= 0) {
          ioctl(console_fd, TIOCCONS, 0);
          close(console_fd);
        }
***/
#endif /* MAIKO_HANDLE_CONSOLE_MESSAGES */
}